

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxOutData(Psbt *this,uint32_t index,Script *redeem_script,KeyData *key)

{
  initializer_list<cfd::core::KeyData> __l;
  allocator_type local_189;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_188;
  KeyData local_170;
  
  KeyData::KeyData(&local_170,key);
  __l._M_len = 1;
  __l._M_array = &local_170;
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            (&local_188,__l,&local_189);
  SetTxOutData(this,index,redeem_script,&local_188);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_188);
  KeyData::~KeyData(&local_170);
  return;
}

Assistant:

void Psbt::SetTxOutData(
    uint32_t index, const Script &redeem_script, const KeyData &key) {
  SetTxOutData(index, redeem_script, std::vector<KeyData>{key});
}